

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_triangles_to_quads
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node,float prop)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  TriangleMeshNode *pTVar7;
  ulong uVar8;
  long local_78;
  float local_6c;
  long *local_68;
  Ref<embree::SceneGraph::Node> *local_60;
  Node *local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::TriangleMeshNode> local_38;
  
  local_6c = prop;
  if (node->ptr == (Node *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar3 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar4 = (long *)0x0;
    }
    else {
      plVar4 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    local_60 = node;
    local_58 = (Node *)this;
    if (plVar4 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_68 = plVar4;
      if (plVar5 == (long *)0x0) {
        if (local_60->ptr == (Node *)0x0) {
          pTVar7 = (TriangleMeshNode *)0x0;
        }
        else {
          pTVar7 = (TriangleMeshNode *)
                   __dynamic_cast(local_60->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        if (pTVar7 != (TriangleMeshNode *)0x0) {
          (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
          iVar2 = rand();
          this = (SceneGraph *)local_58;
          if ((float)iVar2 * 4.656613e-10 <= local_6c) {
            local_38.ptr = pTVar7;
            (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
            plVar4 = local_68;
            convert_triangles_to_quads(this,&local_38);
            (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[3])(pTVar7);
          }
          else {
            (local_58->super_RefCount)._vptr_RefCount = (_func_int **)local_60->ptr;
            local_60->ptr = (Node *)0x0;
            plVar4 = local_68;
          }
          (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[3])(pTVar7);
          if (plVar4 == (long *)0x0) {
            bVar1 = false;
            node = local_60;
          }
          else {
            (**(code **)(*plVar4 + 0x18))(plVar4);
            bVar1 = false;
            node = local_60;
          }
          goto LAB_0014fcc7;
        }
      }
      else {
        (**(code **)(*plVar5 + 0x10))(plVar5);
        lVar6 = plVar5[0xd];
        if (plVar5[0xe] != lVar6) {
          uVar8 = 0;
          do {
            local_50.ptr = *(Node **)(lVar6 + uVar8 * 8);
            if (local_50.ptr != (Node *)0x0) {
              (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_triangles_to_quads((SceneGraph *)&local_78,&local_50,local_6c);
            lVar6 = plVar5[0xd];
            plVar4 = *(long **)(lVar6 + uVar8 * 8);
            if (plVar4 != (long *)0x0) {
              (**(code **)(*plVar4 + 0x18))();
            }
            *(long *)(lVar6 + uVar8 * 8) = local_78;
            local_78 = 0;
            if (local_50.ptr != (Node *)0x0) {
              (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
            uVar8 = uVar8 + 1;
            lVar6 = plVar5[0xd];
          } while (uVar8 < (ulong)(plVar5[0xe] - lVar6 >> 3));
        }
      }
      plVar4 = local_68;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x18))(plVar5);
      }
    }
    else {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      local_48.ptr = (Node *)plVar4[0x10];
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_triangles_to_quads((SceneGraph *)&local_78,&local_48,local_6c);
      if ((long *)plVar4[0x10] != (long *)0x0) {
        (**(code **)(*(long *)plVar4[0x10] + 0x18))();
      }
      plVar4[0x10] = local_78;
      local_78 = 0;
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    bVar1 = true;
    node = local_60;
    this = (SceneGraph *)local_58;
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x18))(plVar4);
      node = local_60;
      this = (SceneGraph *)local_58;
      bVar1 = true;
    }
  }
  else {
    (**(code **)(*plVar3 + 0x10))(plVar3);
    local_40.ptr = (Node *)plVar3[0x13];
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_triangles_to_quads((SceneGraph *)&local_78,&local_40,local_6c);
    if ((long *)plVar3[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar3[0x13] + 0x18))();
    }
    plVar3[0x13] = local_78;
    local_78 = 0;
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar1 = true;
  }
LAB_0014fcc7:
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x18))(plVar3);
  }
  if (bVar1) {
    (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
    node->ptr = (Node *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_triangles_to_quads(Ref<SceneGraph::Node> node, float prop)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_triangles_to_quads(xfmNode->child,prop);
    } 
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_triangles_to_quads(xfmNode->child,prop);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_triangles_to_quads(groupNode->children[i],prop);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> tmesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
      if (random<float>() <= prop) return convert_triangles_to_quads(tmesh);
      else                         return node;
    }
    return node;
  }